

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

void Abc_NtkSetMvVarValues(Abc_Obj_t *pObj,int nValues)

{
  void *pvVar1;
  Mem_Flex_t *p;
  int *pV;
  temp *pVarStruct;
  Mem_Flex_t *pFlex;
  int nValues_local;
  Abc_Obj_t *pObj_local;
  
  if (nValues < 2) {
    __assert_fail("nValues > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBlifMv.c"
                  ,0x5f,"void Abc_NtkSetMvVarValues(Abc_Obj_t *, int)");
  }
  if ((nValues != 2) && (pvVar1 = Abc_ObjMvVar(pObj), pvVar1 == (void *)0x0)) {
    p = (Mem_Flex_t *)Abc_NtkMvVarMan(pObj->pNtk);
    pV = (int *)Mem_FlexEntryFetch(p,0x10);
    *pV = nValues;
    pV[2] = 0;
    pV[3] = 0;
    Abc_ObjSetMvVar(pObj,pV);
  }
  return;
}

Assistant:

void Abc_NtkSetMvVarValues( Abc_Obj_t * pObj, int nValues )
{
    Mem_Flex_t * pFlex;
    struct temp 
    { 
        int nValues; 
        char ** pNames; 
    } * pVarStruct;
    assert( nValues > 1 );
    // skip binary signals
    if ( nValues == 2 )
        return;
    // skip already assigned signals
    if ( Abc_ObjMvVar(pObj) != NULL )
        return;
    // create the structure
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pObj->pNtk );
    pVarStruct = (struct temp *)Mem_FlexEntryFetch( pFlex, sizeof(struct temp) );
    pVarStruct->nValues = nValues;
    pVarStruct->pNames = NULL;
    Abc_ObjSetMvVar( pObj, pVarStruct );
}